

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O3

void limit_message(string *message,size_t chatlength)

{
  long *plVar1;
  long *plVar2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if (chatlength < message->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)message);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_28 = *plVar2;
      lStack_20 = plVar1[3];
      local_38 = &local_28;
    }
    else {
      local_28 = *plVar2;
      local_38 = (long *)*plVar1;
    }
    local_30 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)message,(string *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,local_28 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return;
}

Assistant:

static void limit_message(std::string &message, std::size_t chatlength)
{
	if (message.length() > chatlength)
	{
		message = message.substr(0, chatlength - 6) + " [...]";
	}
}